

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLSolver::InitAutoStub(NLSolver *this)

{
  result_type_conflict rVar1;
  char (*__source) [64];
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  path *ppVar3;
  NLSolver *in_RDI;
  char rnds [64];
  path path;
  uniform_int_distribution<unsigned_long> rand;
  mt19937 prng;
  random_device dev;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd798;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__urng;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd7a0;
  value_type *in_stack_ffffffffffffd7a8;
  char (*in_stack_ffffffffffffd7b8) [6];
  path *this_00;
  undefined4 in_stack_ffffffffffffd7d0;
  string local_2828 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd7e0;
  char *in_stack_ffffffffffffd7e8;
  string local_2808 [32];
  string local_27e8 [32];
  string local_27c8 [32];
  undefined1 local_27a8 [32];
  unsigned_long local_2788;
  unsigned_long uStack_2780;
  unsigned_long local_2778;
  unsigned_long uStack_2770;
  path local_1390 [125];
  
  this_00 = local_1390;
  std::random_device::random_device((random_device *)in_stack_ffffffffffffd7e0);
  rVar1 = std::random_device::operator()((random_device *)0x122738);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffd7a0,(result_type)in_stack_ffffffffffffd798);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffd7a0,
             (unsigned_long)in_stack_ffffffffffffd798,0x12276d);
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::operator/=((path *)in_RDI,in_stack_ffffffffffffd7b8);
  local_2778 = 0;
  uStack_2770 = 0;
  local_2788 = 0;
  uStack_2780 = 0;
  local_27a8._16_8_ = 0;
  local_27a8._24_8_ = 0;
  local_27a8._8_8_ = 0;
  local_27a8._0_8_ = 0x786568646e72;
  ppVar3 = (path *)local_27a8;
  __source = (char (*) [64])
             std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffd7a0,
                        in_stack_ffffffffffffd798);
  snprintf((char *)ppVar3,0x3f,"%lX",__source);
  std::filesystem::__cxx11::path::operator+=
            ((path *)in_stack_ffffffffffffd7a0,(char (*) [64])in_stack_ffffffffffffd798);
  std::filesystem::__cxx11::path::operator+=(ppVar3,in_stack_ffffffffffffd7a8);
  std::filesystem::__cxx11::path::string(this_00);
  std::__cxx11::string::operator=((string *)&in_RDI->pathstr_,local_27c8);
  std::__cxx11::string::~string(local_27c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = mkdtemp(pcVar2);
  if (pcVar2 == (char *)0x0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Utils(in_RDI);
    std::operator+(in_stack_ffffffffffffd7e8,in_stack_ffffffffffffd7e0);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffd7a0);
    (**(code **)(*(long *)__lhs + 0x38))(__lhs,local_27e8);
    std::__cxx11::string::~string(local_27e8);
    std::__cxx11::string::~string(local_2808);
  }
  std::filesystem::__cxx11::path::operator=
            ((path *)CONCAT44(rVar1,in_stack_ffffffffffffd7d0),&this_00->_M_pathname);
  __urng = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_27a8;
  ppVar3 = (path *)std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)in_stack_ffffffffffffd7a0,
                              __urng);
  snprintf((char *)__urng,0x3f,"%lX",ppVar3);
  std::filesystem::__cxx11::path::operator/=((path *)in_RDI,__source);
  std::filesystem::__cxx11::path::string(this_00);
  std::__cxx11::string::operator=((string *)&in_RDI->filestub_,local_2828);
  std::__cxx11::string::~string(local_2828);
  std::filesystem::__cxx11::path::~path(ppVar3);
  std::random_device::~random_device((random_device *)0x122a63);
  return;
}

Assistant:

void NLSolver::InitAutoStub() {
  // init file stub
  std::random_device dev;
  std::mt19937 prng(dev());
  std::uniform_int_distribution<unsigned long> rand(0);
  auto path = std::filesystem::temp_directory_path();
  path /= "nlw2_"; // via '/'
  char rnds[64] = "rndhex";
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path += rnds;    // no '/'

  path += "_XXXXXX";
  pathstr_ = path.string();

#if defined(_WIN32) || defined(_WIN64)
  auto p1 = _mktemp((char*)pathstr_.c_str());
  assert(p1);
  if (!std::filesystem::create_directory(pathstr_))
    Utils().myexit("Could not create temp dir '"
                   + pathstr_ + "'");
#else
  if (!mkdtemp((char*)pathstr_.c_str()))
    Utils().myexit("Could not create a temp dir\n"
                   "from pattern '" + pathstr_ + "'");
#endif
  path = pathstr_;
  // Plus filename
  std::snprintf(rnds, sizeof(rnds)-1, "%lX", rand(prng));
  path /= rnds;
  filestub_ = path.string();
}